

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::argSynopsis
          (CommandLine<Catch::ConfigData> *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  Arg *pAVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  string *psVar5;
  ostream *poVar6;
  logic_error *this_00;
  _Base_ptr p_Var7;
  size_type *psVar8;
  uint uVar9;
  
  if (this->m_highestSpecifiedArgPosition < 1) {
    if ((this->m_floatingArg)._M_t.
        super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
        .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
        _M_head_impl == (Arg *)0x0) {
      return;
    }
  }
  else {
    p_Var1 = &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 1;
    do {
      if (1 < uVar9) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      }
      p_Var4 = (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var4 == (_Base_ptr)0x0) {
LAB_0013025c:
        if ((this->m_floatingArg)._M_t.
            super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
            .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
            _M_head_impl == (Arg *)0x0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_00,"non consecutive positional arguments with no floating args");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
        pAVar2 = (this->m_floatingArg)._M_t.
                 super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                 .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
                 _M_head_impl;
        psVar5 = &(pAVar2->super_CommonArgProperties<Catch::ConfigData>).placeholder;
        psVar8 = (size_type *)
                 ((long)&(pAVar2->super_CommonArgProperties<Catch::ConfigData>).placeholder + 8);
      }
      else {
        do {
          if ((int)uVar9 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var7 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < (int)uVar9];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           ((int)uVar9 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_0013025c;
        std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
        psVar5 = (string *)((undefined1 *)((long)p_Var7 + 0x50) + 0x20);
        psVar8 = (size_type *)((long)p_Var7 + 0x78);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(psVar5->_M_dataplus)._M_p,*psVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,">",1);
      bVar3 = (int)uVar9 < this->m_highestSpecifiedArgPosition;
      uVar9 = uVar9 + 1;
    } while (bVar3);
    if ((this->m_floatingArg)._M_t.
        super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
        .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
        _M_head_impl == (Arg *)0x0) {
      return;
    }
    if (1 < this->m_highestSpecifiedArgPosition) {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"[<",2);
  pAVar2 = (this->m_floatingArg)._M_t.
           super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
           _M_head_impl;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(pAVar2->super_CommonArgProperties<Catch::ConfigData>).placeholder.
                         _M_dataplus._M_p,
                      *(size_type *)
                       ((long)&(pAVar2->super_CommonArgProperties<Catch::ConfigData>).placeholder +
                       8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> ...]",6);
  return;
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.placeholder << ">";
                else if( m_floatingArg.get() )
                    os << "<" << m_floatingArg->placeholder << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_floatingArg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_floatingArg->placeholder << "> ...]";
            }
        }